

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv.c
# Opt level: O1

uint64_t SharpYUVUpdateY_C(uint16_t *ref,uint16_t *src,uint16_t *dst,int len)

{
  uint64_t uVar1;
  uint16_t uVar2;
  ushort uVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  
  if (0 < len) {
    uVar5 = 0;
    uVar1 = 0;
    do {
      iVar6 = (uint)ref[uVar5] - (uint)src[uVar5];
      iVar4 = (uint)dst[uVar5] + iVar6;
      if (0x3fe < iVar4) {
        iVar4 = 0x3ff;
      }
      uVar2 = (uint16_t)iVar4;
      if (iVar4 < 1) {
        uVar2 = 0;
      }
      dst[uVar5] = uVar2;
      uVar3 = -(ushort)iVar6;
      if (0 < iVar6) {
        uVar3 = (ushort)iVar6;
      }
      uVar1 = uVar1 + uVar3;
      uVar5 = uVar5 + 1;
    } while ((uint)len != uVar5);
    return uVar1;
  }
  return 0;
}

Assistant:

static uint64_t SharpYUVUpdateY_C(const uint16_t* ref, const uint16_t* src,
                                  uint16_t* dst, int len) {
  uint64_t diff = 0;
  int i;
  for (i = 0; i < len; ++i) {
    const int diff_y = ref[i] - src[i];
    const int new_y = (int)dst[i] + diff_y;
    dst[i] = clip_y(new_y);
    diff += (uint64_t)abs(diff_y);
  }
  return diff;
}